

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int status;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  lua_State *L;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  
  uVar4 = luaB_getmemcontrol();
  L = (lua_State *)lua_newstate(debug_realloc,uVar4);
  if (L == (lua_State *)0x0) {
    l_message((lua_State *)0x0,*argv,"cannot create state: not enough memory");
    uVar3 = 1;
  }
  else {
    pcVar5 = getenv("RAVI_DEBUG_EXPR");
    pcVar6 = getenv("RAVI_DEBUG_CODEGEN");
    cVar7 = (pcVar5 != (char *)0x0) + '\x02';
    if (pcVar6 == (char *)0x0) {
      cVar7 = pcVar5 != (char *)0x0;
    }
    pcVar5 = getenv("RAVI_DEBUG_VARS");
    cVar1 = cVar7 + '\x04';
    if (pcVar5 == (char *)0x0) {
      cVar1 = cVar7;
    }
    pcVar5 = getenv("RAVI_DEBUG_STACK");
    cVar7 = cVar1 + '\b';
    if (pcVar5 == (char *)0x0) {
      cVar7 = cVar1;
    }
    ravi_set_debuglevel(cVar7);
    lua_pushcclosure(L,pmain,0);
    lua_pushinteger(L,(long)argc);
    lua_pushlightuserdata(L,argv);
    status = lua_pcallk(L,2,1,0,0,0);
    iVar2 = lua_toboolean(L,0xffffffffffffffff);
    report(L,status);
    lua_close(L);
    uVar3 = (uint)(status != 0 || iVar2 == 0);
  }
  return uVar3;
}

Assistant:

int main (int argc, char **argv) {
  int status, result;
  lua_State *L = luaL_newstate();  /* create state */
  if (L == NULL) {
    l_message(L, argv[0], "cannot create state: not enough memory");
    return EXIT_FAILURE;
  }
  int level = 0;
  if (getenv("RAVI_DEBUG_EXPR"))
    level |= 1;
  if (getenv("RAVI_DEBUG_CODEGEN"))
    level |= 2;
  if (getenv("RAVI_DEBUG_VARS"))
    level |= 4;
  if (getenv("RAVI_DEBUG_STACK"))
    level |= 8;
  ravi_set_debuglevel(level);

  lua_pushcfunction(L, &pmain);  /* to call 'pmain' in protected mode */
  lua_pushinteger(L, argc);  /* 1st argument */
  lua_pushlightuserdata(L, argv); /* 2nd argument */
  status = lua_pcall(L, 2, 1, 0);  /* do the call */
  result = lua_toboolean(L, -1);  /* get result */
  report(L, status);
  lua_close(L);
  return (result && status == LUA_OK) ? EXIT_SUCCESS : EXIT_FAILURE;
}